

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asc2log.c
# Opt level: O1

int main(int argc,char **argv)

{
  byte *pbVar1;
  __time_t _Var2;
  char cVar3;
  unsigned_long_long uVar4;
  undefined5 uVar5;
  undefined2 uVar6;
  undefined8 uVar7;
  uchar dlc_00;
  byte bVar8;
  undefined1 uVar9;
  int iVar10;
  int iVar11;
  FILE *__stream;
  FILE *pFVar12;
  size_t sVar13;
  char timestamps;
  undefined1 *puVar14;
  ulong uVar15;
  char *pcVar16;
  char cVar17;
  int dplace;
  int *piVar18;
  FILE *outfile;
  long lVar19;
  uint uVar20;
  char *pcVar21;
  bool bVar22;
  char rtr;
  uchar secbit;
  uchar vcid;
  uchar sdt;
  int dlc;
  int interface;
  int local_2264;
  int n;
  int local_225c;
  int dlen_1;
  uchar brs;
  FILE *local_2250;
  char dir_1 [5];
  unsigned_long_long sec_1;
  uchar esi;
  char dir [5];
  int n_1;
  char tmp1 [10];
  int data [8];
  int dlc_2;
  unsigned_long_long sec;
  char tmp2 [10];
  char idstr [21];
  int interface_2;
  unsigned_long_long usec;
  tm tms;
  char buf [6500];
  
  pFVar12 = _stdout;
  __stream = _stdin;
LAB_00101400:
  do {
    while (local_2250 = pFVar12, iVar10 = getopt(argc,argv,"I:O:dv?"), iVar10 < 0x4f) {
      if (iVar10 == -1) {
        pcVar16 = fgets(buf,0x1963,__stream);
        if (pcVar16 == (char *)0x0) goto LAB_00102237;
        goto LAB_001014d4;
      }
      if (iVar10 != 0x49) {
        if (iVar10 == 0x3f) {
          pcVar16 = __xpg_basename(*argv);
          print_usage(pcVar16);
          return 0;
        }
        goto LAB_00102284;
      }
      __stream = fopen(_optarg,"r");
      pFVar12 = local_2250;
      if (__stream == (FILE *)0x0) {
        pcVar16 = "infile";
LAB_001022c2:
        perror(pcVar16);
        return 1;
      }
    }
    puVar14 = &main_disable_dir;
    if (iVar10 != 100) {
      if (iVar10 != 0x76) {
        if (iVar10 != 0x4f) {
LAB_00102284:
          main_cold_3();
          return 1;
        }
        pFVar12 = fopen(_optarg,"w");
        if (pFVar12 == (FILE *)0x0) {
          pcVar16 = "outfile";
          goto LAB_001022c2;
        }
        goto LAB_00101400;
      }
      puVar14 = &main_verbose;
    }
    *puVar14 = 1;
    pFVar12 = local_2250;
  } while( true );
LAB_001014d4:
  pcVar16 = buf + 9;
  if (main::dplace == 0) {
    if ((main::base == '\0') &&
       (iVar10 = __isoc99_sscanf(buf,"base %9s timestamps %9s",tmp1,tmp2), iVar10 == 2)) {
      main::base = tmp1[0];
      main::timestamps = tmp2[0];
      if (main_verbose == '\x01') {
        printf("base %c timestamps %c\n");
      }
      if ((main::base != 'd') && (main::base != 'h')) {
        pcVar21 = "invalid base %s (must be \'hex\' or \'dez\')!\n";
        pcVar16 = tmp1;
LAB_001022ad:
        printf(pcVar21,pcVar16);
        return 1;
      }
      uVar7 = eval_canxl_xl_read_tv._0_8_;
      if ((main::timestamps != 'a') && (main::timestamps != 'r')) {
        pcVar21 = "invalid timestamps %s (must be \'absolute\' or \'relative\')!\n";
        pcVar16 = tmp2;
        goto LAB_001022ad;
      }
    }
    else if ((main::date_tv.tv_sec == 0) && (buf._0_4_ == 0x65746164)) {
      data[0] = 0;
      pcVar21 = strcasestr(pcVar16," am ");
      if ((pcVar21 == (char *)0x0) && (pcVar21 = strcasestr(pcVar16," pm "), pcVar21 == (char *)0x0)
         ) {
        pcVar21 = setlocale(2,"de_DE");
        if (pcVar21 == (char *)0x0) goto LAB_00101e6d;
        pcVar21 = strptime(pcVar16,"%B %d %H:%M:%S %Y",(tm *)&tms);
        if (pcVar21 == (char *)0x0) {
          pcVar21 = "%B %d %H:%M:%S.%Y %Y";
LAB_00101750:
          pcVar21 = strptime(pcVar16,pcVar21,(tm *)&tms);
          if (pcVar21 != (char *)0x0) {
            __isoc99_sscanf(pcVar16,"%*s %*d %*d:%*d:%*d.%3u ",data);
            goto LAB_00101777;
          }
          goto LAB_00101e72;
        }
LAB_00101777:
        main::date_tv.tv_sec = mktime((tm *)&tms);
        main::date_tv.tv_usec = (__suseconds_t)(uint)(data[0] * 1000);
        if (main::date_tv.tv_sec < 0) goto LAB_00101e72;
      }
      else {
        pcVar21 = setlocale(2,"en_US");
        if (pcVar21 != (char *)0x0) {
          pcVar21 = strptime(pcVar16,"%B %d %I:%M:%S %p %Y",(tm *)&tms);
          if (pcVar21 == (char *)0x0) {
            pcVar21 = "%B %d %I:%M:%S.%Y %p %Y";
            goto LAB_00101750;
          }
          goto LAB_00101777;
        }
LAB_00101e6d:
        main_cold_1();
LAB_00101e72:
        main_cold_2();
      }
      _Var2 = main::date_tv.tv_sec;
      uVar7 = eval_canxl_xl_read_tv._0_8_;
      if (main_verbose == '\x01') {
        pcVar16 = ctime(&main::date_tv.tv_sec);
        printf("date %llu => %s",_Var2,pcVar16);
        uVar7 = eval_canxl_xl_read_tv._0_8_;
      }
    }
    else {
      iVar10 = __isoc99_sscanf(buf,"%llu.%9s %9s ",&sec,tmp2,tmp1);
      uVar7 = eval_canxl_xl_read_tv._0_8_;
      if (iVar10 == 3) {
        sVar13 = strlen(tmp2);
        main::dplace = (int)sVar13;
        if (main_verbose == '\x01') {
          printf("decimal place %d, e.g. \'%s\'\n",sVar13 & 0xffffffff,tmp2);
        }
        if (main::dplace - 7U < 0xfffffffd) {
          printf("invalid dplace %d (must be 4, 5 or 6)!\n");
          return 1;
        }
        goto LAB_001014e1;
      }
    }
  }
  else {
LAB_001014e1:
    iVar11 = __isoc99_sscanf(buf,"%llu.%llu %9s ",&sec,&usec,tmp1);
    cVar3 = main::timestamps;
    cVar17 = main::base;
    iVar10 = main::dplace;
    bVar8 = main_disable_dir;
    uVar7 = eval_canxl_xl_read_tv._0_8_;
    if (iVar11 == 3) {
      timestamps = (char)main::dplace;
      if (tmp1[4] == 'L' && tmp1._0_4_ == 0x584e4143) {
        uVar20 = (uint)main_disable_dir;
        outfile = (FILE *)&dlc;
        iVar11 = __isoc99_sscanf(buf,"%llu.%llu %*s %d %4s %4s ",dir_1,dir,&interface_2,outfile,&rtr
                                );
        uVar7 = eval_canxl_xl_read_tv._0_8_;
        if (((iVar11 == 5) &&
            (sVar13 = strlen((char *)&dlc), uVar7 = eval_canxl_xl_read_tv._0_8_, sVar13 == 2)) &&
           (sVar13 = strlen(&rtr), uVar7 = eval_canxl_xl_read_tv._0_8_, sVar13 == 4)) {
          if (_rtr == 0x46464c58) {
            memset(&tms,0,0x80c);
            dlen_1 = 0;
            n_1 = 0;
            piVar18 = &n;
            iVar11 = __isoc99_sscanf(buf,
                                     "%llu.%llu %*s %d %4s %*s %*s %*s %20s %hhx %hhx %x %d %*s %*s %hhx %x %n"
                                     ,idstr,&sec_1,piVar18,&interface,data,&sdt,&secbit,&dlc_2,
                                     &dlen_1,&vcid,&brs,&n_1);
            if (iVar11 != 0xb) {
              piVar18 = &n;
              iVar11 = __isoc99_sscanf(buf,
                                       "%llu.%llu %*s %d %4s %*s %*s %*s %20s %*s %hhx %hhx %x %d %*s %*s %hhx %x %n"
                                       ,idstr,&sec_1,piVar18,&interface,data,&sdt,&secbit,&dlc_2,
                                       &dlen_1,&vcid,&brs,&n_1);
              uVar7 = eval_canxl_xl_read_tv._0_8_;
              if (iVar11 != 0xb) goto LAB_00101e08;
            }
            uVar4 = sec_1;
            uVar7._0_1_ = idstr[0];
            uVar7._1_1_ = idstr[1];
            uVar7._2_1_ = idstr[2];
            uVar7._3_1_ = idstr[3];
            uVar7._4_1_ = idstr[4];
            uVar7._5_1_ = idstr[5];
            uVar7._6_1_ = idstr[6];
            uVar7._7_1_ = idstr[7];
            eval_canxl_xl_read_tv[0] = idstr[0];
            eval_canxl_xl_read_tv[1] = idstr[1];
            eval_canxl_xl_read_tv[2] = idstr[2];
            eval_canxl_xl_read_tv[3] = idstr[3];
            eval_canxl_xl_read_tv[4] = idstr[4];
            eval_canxl_xl_read_tv[5] = idstr[5];
            eval_canxl_xl_read_tv[6] = idstr[6];
            eval_canxl_xl_read_tv[7] = idstr[7];
            eval_canxl_xl_read_tv._8_8_ = sec_1;
            if (((dlen_1 < 0x801) && (uVar7 = eval_canxl_xl_read_tv._0_8_, dlc_2 < 0x800)) &&
               (secbit < 2)) {
              tms.tm_min._1_1_ = sdt;
              tms.tm_hour = _brs;
              local_2264 = dlc_2;
              local_225c = dlen_1;
              sVar13 = strlen((char *)&interface);
              uVar7 = eval_canxl_xl_read_tv._0_8_;
              if (sVar13 == 2) {
                if (uVar20 != 0) {
                  interface = CONCAT31(interface._1_3_,0x2e);
                }
                if ((iVar10 != 4 || (long)uVar4 < 0x147ae14) &&
                   (local_225c == local_2264 + 1 && ((long)uVar4 < 0xccccccc || iVar10 != 5))) {
                  get_can_id((canid_t *)&tms,(char *)data,0x10);
                  iVar10 = (int)piVar18;
                  uVar7 = eval_canxl_xl_read_tv._0_8_;
                  if ((uint)tms.tm_sec < 0x800) {
                    if (vcid != '\0') {
                      tms.tm_sec = (uint)vcid << 0x10 | tms.tm_sec;
                    }
                    pcVar16 = buf + n_1;
                    tms.tm_min._2_2_ = (short)dlen_1;
                    if (0 < dlen_1) {
                      lVar19 = 0;
                      do {
                        bVar8 = asc2nibble(*pcVar16);
                        uVar7 = eval_canxl_xl_read_tv._0_8_;
                        if (0xf < bVar8) goto LAB_00101e08;
                        *(byte *)((long)&tms.tm_mday + lVar19) = bVar8 << 4;
                        bVar8 = asc2nibble(pcVar16[1]);
                        iVar10 = (int)piVar18;
                        uVar7 = eval_canxl_xl_read_tv._0_8_;
                        if (0xf < bVar8) goto LAB_00101e08;
                        pbVar1 = (byte *)((long)&tms.tm_mday + lVar19);
                        *pbVar1 = *pbVar1 | bVar8;
                        pcVar16 = pcVar16 + 3;
                        lVar19 = lVar19 + 1;
                      } while (lVar19 < dlen_1);
                    }
                    iVar11 = __isoc99_sscanf(pcVar16,"%*x %x ",&esi);
                    uVar7 = eval_canxl_xl_read_tv._0_8_;
                    if ((iVar11 == 1) && ((_esi >> 0x16 & 1) != 0)) {
                      tms.tm_min._0_1_ = (byte)(_esi >> 0x16) & 2 | (_esi >> 0x18 & 1) == 0 ^ 0x81U;
                      puVar14 = eval_canxl_xl_tv;
                      calc_tv((timeval *)eval_canxl_xl_tv,(timeval *)eval_canxl_xl_read_tv,
                              (timeval *)(ulong)(uint)(int)cVar3,timestamps,iVar10);
                      iVar10 = n;
                      cVar17 = (char)interface;
                      goto LAB_00101dde;
                    }
                  }
                }
              }
            }
          }
          else if ((_rtr == 0x46464246) || (_rtr == 0x46464546)) {
            eval_canxl_fd(buf,(timeval *)(ulong)(uint)(int)cVar3,timestamps,uVar20,(int)local_2250,
                          outfile);
            uVar7 = eval_canxl_xl_read_tv._0_8_;
          }
          else if ((_rtr == 0x46464243) || (_rtr == 0x46464543)) {
            eval_canxl_cc(buf,(timeval *)(ulong)(uint)(int)cVar3,timestamps,uVar20,(int)local_2250,
                          outfile);
            uVar7 = eval_canxl_xl_read_tv._0_8_;
          }
        }
      }
      else if (tmp1[4] == 'D' && tmp1._0_4_ == 0x464e4143) {
        local_225c = CONCAT31(local_225c._1_3_,main::timestamps);
        tms.tm_zone = (char *)0x0;
        tms.tm_isdst = 0;
        tms._36_4_ = 0;
        tms.tm_gmtoff = 0;
        tms.tm_mon = 0;
        tms.tm_year = 0;
        tms.tm_wday = 0;
        tms.tm_yday = 0;
        tms.tm_sec = 0;
        tms.tm_min = 0;
        tms.tm_hour = 0;
        tms.tm_mday = 0;
        _rtr = 0;
        n = 0;
        pcVar16 = dir;
        iVar11 = __isoc99_sscanf(buf,"%llu.%llu %*s %d %4s %20s %hhx %hhx %x %d %n",idstr,&sec_1,
                                 pcVar16,dir_1,data,&brs,&esi,&dlc,&rtr,&n);
        if (iVar11 != 9) {
          pcVar16 = dir;
          iVar11 = __isoc99_sscanf(buf,"%llu.%llu %*s %d %4s %20s %*s %hhx %hhx %x %d %n",idstr,
                                   &sec_1,pcVar16,dir_1,data,&brs,&esi,&dlc,&rtr,&n);
          uVar7 = eval_canxl_xl_read_tv._0_8_;
          if (iVar11 != 9) goto LAB_00101e08;
        }
        uVar4 = sec_1;
        uVar20 = _rtr;
        eval_canfd_read_tv[0] = idstr[0];
        eval_canfd_read_tv[1] = idstr[1];
        eval_canfd_read_tv[2] = idstr[2];
        eval_canfd_read_tv[3] = idstr[3];
        eval_canfd_read_tv[4] = idstr[4];
        eval_canfd_read_tv[5] = idstr[5];
        eval_canfd_read_tv[6] = idstr[6];
        eval_canfd_read_tv[7] = idstr[7];
        eval_canfd_read_tv._8_8_ = sec_1;
        uVar7 = eval_canxl_xl_read_tv._0_8_;
        if (((((int)_rtr < 0x41) && (dlc < 0x10)) && (brs < 2)) &&
           ((esi < 2 && (sVar13 = strlen(dir_1), uVar7 = eval_canxl_xl_read_tv._0_8_, sVar13 == 2)))
           ) {
          if ((bVar8 & 1) != 0) {
            dir_1[0] = '.';
          }
          if ((iVar10 != 4 || (long)uVar4 < 0x147ae14) && (iVar10 != 5 || (long)uVar4 < 0xccccccc))
          {
            dlc_00 = can_fd_len2dlc((uchar)uVar20);
            bVar8 = can_fd_dlc2len(dlc_00);
            uVar7 = eval_canxl_xl_read_tv._0_8_;
            if (uVar20 == bVar8) {
              get_can_id((canid_t *)&tms,(char *)data,0x10);
              iVar10 = (int)pcVar16;
              pcVar21 = buf + n;
              tms.tm_min._0_1_ = (char)_rtr;
              if (0 < (int)_rtr) {
                lVar19 = 0;
                do {
                  bVar8 = asc2nibble(*pcVar21);
                  uVar7 = eval_canxl_xl_read_tv._0_8_;
                  if (0xf < bVar8) goto LAB_00101e08;
                  *(byte *)((long)&tms.tm_hour + lVar19) = bVar8 << 4;
                  bVar8 = asc2nibble(pcVar21[1]);
                  iVar10 = (int)pcVar16;
                  uVar7 = eval_canxl_xl_read_tv._0_8_;
                  if (0xf < bVar8) goto LAB_00101e08;
                  pbVar1 = (byte *)((long)&tms.tm_hour + lVar19);
                  *pbVar1 = *pbVar1 | bVar8;
                  pcVar21 = pcVar21 + 3;
                  lVar19 = lVar19 + 1;
                } while (lVar19 < (int)_rtr);
              }
              iVar11 = __isoc99_sscanf(pcVar21,"   %*x %*x %x ",&interface);
              uVar7 = eval_canxl_xl_read_tv._0_8_;
              if (iVar11 == 1) {
                if (((uint)interface >> 0xc & 1) == 0) {
                  if ((interface & 0x10U) != 0) {
                    uVar9 = (char)dlc;
                    if (7 < dlc) {
                      uVar9 = 8;
                    }
                    tms._0_8_ = CONCAT35(tms.tm_min._1_3_,CONCAT14(uVar9,tms.tm_sec)) | 0x40000000;
                  }
                  if (dlc - 9U < 7 && (byte)tms.tm_min == '\b') {
                    tms.tm_min._3_1_ = (char)dlc;
                  }
                }
                else {
                  bVar22 = ((uint)interface >> 0xd & 1) == 0;
                  uVar6 = tms.tm_min._2_2_;
                  uVar5 = tms._0_5_;
                  tms._0_8_ = CONCAT26(tms.tm_min._2_2_,CONCAT15(bVar22,tms._0_5_)) ^ 0x50000000000;
                  if (((uint)interface >> 0xe & 1) != 0) {
                    tms._0_8_ = CONCAT26(uVar6,CONCAT15(bVar22,uVar5)) ^ 0x50000000000 |
                                0x20000000000;
                  }
                }
                calc_tv((timeval *)eval_canfd_tv,(timeval *)eval_canfd_read_tv,
                        (timeval *)(ulong)(uint)(int)(char)local_225c,timestamps,iVar10);
                puVar14 = eval_canfd_tv;
                iVar10 = dir._0_4_;
                cVar17 = dir_1[0];
                goto LAB_00101dde;
              }
            }
          }
        }
      }
      else {
        local_2264 = main::dplace;
        tms.tm_zone = (char *)0x0;
        tms.tm_isdst = 0;
        tms._36_4_ = 0;
        tms.tm_gmtoff = 0;
        tms.tm_mon = 0;
        tms.tm_year = 0;
        tms.tm_wday = 0;
        tms.tm_yday = 0;
        tms.tm_sec = 0;
        tms.tm_min = 0;
        tms.tm_hour = 0;
        tms.tm_mday = 0;
        dlc = 0;
        piVar18 = &interface;
        iVar10 = __isoc99_sscanf(buf,"%llu.%llu %d %20s",&sec_1,dir_1,piVar18,idstr);
        if (iVar10 == 4) {
          eval_can_read_tv._0_8_ = sec_1;
          eval_can_read_tv._9_7_ = stack0xffffffffffffddb9;
          eval_can_read_tv[8] = dir_1[0];
          if (idstr._8_2_ != 0x656d || idstr._0_8_ != 0x617246726f727245) goto LAB_00101607;
          tms._0_5_ = 0x820000080;
          calc_tv((timeval *)eval_can_tv,(timeval *)eval_can_read_tv,
                  (timeval *)(ulong)(uint)(int)cVar3,(char)local_2264,(int)piVar18);
          puVar14 = eval_can_tv;
          iVar10 = interface;
          cVar17 = '.';
LAB_00101dde:
          pFVar12 = local_2250;
          prframe((FILE *)local_2250,(timeval *)puVar14,iVar10,(cu_t *)&tms,cVar17);
          fflush(pFVar12);
          uVar7 = eval_canxl_xl_read_tv._0_8_;
        }
        else {
LAB_00101607:
          local_225c = CONCAT31(local_225c._1_3_,cVar3);
          if (cVar17 == 'h') {
            pcVar16 = "%llu.%llu %d %20s %4s %c %x %x %x %x %x %x %x %x %x";
          }
          else {
            pcVar16 = "%llu.%llu %d %20s %4s %c %x %d %d %d %d %d %d %d %d";
          }
          piVar18 = &interface;
          iVar11 = __isoc99_sscanf(buf,pcVar16,&sec_1,dir_1,piVar18,idstr,dir,&rtr,&dlc,data,
                                   data + 1,data + 2,data + 3,data + 4,data + 5,data + 6,data + 7);
          iVar10 = dlc;
          dplace = (int)piVar18;
          eval_can_read_tv._0_8_ = sec_1;
          eval_can_read_tv._9_7_ = stack0xffffffffffffddb9;
          eval_can_read_tv[8] = dir_1[0];
          uVar7 = eval_canxl_xl_read_tv._0_8_;
          if ((6 < iVar11) && (dlc < 0x10)) {
            uVar20 = 8;
            if (dlc < 8) {
              uVar20 = dlc;
            }
            if ((iVar11 == uVar20 + 7) || ((iVar11 == 7 && (rtr == 'r')))) {
              iVar11 = 10;
              if (cVar17 == 'h') {
                iVar11 = 0x10;
              }
              get_can_id((canid_t *)&tms,idstr,iVar11);
              if (8 < dlc) {
                tms.tm_min._3_1_ = (char)dlc;
              }
              sVar13 = strlen(dir);
              uVar7 = eval_canxl_xl_read_tv._0_8_;
              if (sVar13 == 2) {
                if ((bVar8 & 1) != 0) {
                  dir[0] = '.';
                }
                if ((local_2264 != 4 || (long)eval_can_read_tv._8_8_ < 0x147ae14) &&
                   (local_2264 != 5 || (long)eval_can_read_tv._8_8_ < 0xccccccc)) {
                  tms.tm_min._0_1_ = (char)uVar20;
                  if (rtr == 'r') {
                    tms._0_8_ = CONCAT44(tms.tm_min,tms.tm_sec) | 0x40000000;
                  }
                  else if (0 < iVar10) {
                    uVar15 = 0;
                    do {
                      *(char *)((long)&tms.tm_hour + uVar15) = (char)data[uVar15];
                      uVar15 = uVar15 + 1;
                    } while (uVar20 != uVar15);
                  }
                  puVar14 = eval_can_tv;
                  calc_tv((timeval *)eval_can_tv,(timeval *)eval_can_read_tv,
                          (timeval *)(ulong)(uint)(int)(char)local_225c,(char)local_2264,dplace);
                  iVar10 = interface;
                  cVar17 = dir[0];
                  goto LAB_00101dde;
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00101e08:
  eval_canxl_xl_read_tv._0_8_ = uVar7;
  pcVar16 = fgets(buf,0x1963,__stream);
  if (pcVar16 == (char *)0x0) {
LAB_00102237:
    fclose(local_2250);
    fclose(__stream);
    return 0;
  }
  goto LAB_001014d4;
}

Assistant:

int main(int argc, char **argv)
{
	char buf[BUFLEN], tmp1[10], tmp2[10];

	FILE *infile = stdin;
	FILE *outfile = stdout;
	static int verbose, disable_dir;
	static struct timeval date_tv; /* date of the ASC file */
	static int dplace; /* decimal place 4, 5 or 6 or uninitialized */
	static char base; /* 'd'ec or 'h'ex */
	static char timestamps; /* 'a'bsolute or 'r'elative */
	int opt;
	unsigned long long sec, usec;

	while ((opt = getopt(argc, argv, "I:O:dv?")) != -1) {
		switch (opt) {
		case 'I':
			infile = fopen(optarg, "r");
			if (!infile) {
				perror("infile");
				return 1;
			}
			break;

		case 'O':
			outfile = fopen(optarg, "w");
			if (!outfile) {
				perror("outfile");
				return 1;
			}
			break;

		case 'd':
			disable_dir = 1;
			break;

		case 'v':
			verbose = 1;
			break;

		case '?':
			print_usage(basename(argv[0]));
			return 0;
			break;

		default:
			fprintf(stderr, "Unknown option %c\n", opt);
			print_usage(basename(argv[0]));
			return 1;
			break;
		}
	}


	while (fgets(buf, BUFLEN-1, infile)) {

		if (!dplace) { /* the representation of a valid CAN frame not known */

			/* check for base and timestamp entries in the header */
			if ((!base) &&
			    (sscanf(buf, "base %9s timestamps %9s", tmp1, tmp2) == 2)) {
				base = tmp1[0];
				timestamps = tmp2[0];
				if (verbose)
					printf("base %c timestamps %c\n", base, timestamps);
				if ((base != 'h') && (base != 'd')) {
					printf("invalid base %s (must be 'hex' or 'dez')!\n",
					       tmp1);
					return 1;
				}
				if ((timestamps != 'a') && (timestamps != 'r')) {
					printf("invalid timestamps %s (must be 'absolute'"
					       " or 'relative')!\n", tmp2);
					return 1;
				}
				continue;
			}

			/* check for the original logging date in the header */ 
			if ((!date_tv.tv_sec) &&
			    (!strncmp(buf, "date", 4))) {

				if (get_date(&date_tv, &buf[9])) { /* skip 'date day ' */
					fprintf(stderr, "Not able to determine original log "
						"file date. Using current time.\n");
					/* use current date as default */
					gettimeofday(&date_tv, NULL);
				}
				if (verbose)
					printf("date %llu => %s", (unsigned long long)date_tv.tv_sec, ctime(&date_tv.tv_sec));
				continue;
			}

			/* check for decimal places length in valid CAN frames */
			if (sscanf(buf, "%llu.%9s %9s ", &sec, tmp2,
				   tmp1) != 3)
				continue; /* dplace remains zero until first found CAN frame */

			dplace = strlen(tmp2);
			if (verbose)
				printf("decimal place %d, e.g. '%s'\n", dplace,
				       tmp2);
			if (dplace < 4 || dplace > 6) {
				printf("invalid dplace %d (must be 4, 5 or 6)!\n",
				       dplace);
				return 1;
			}
		}

		/*
		 * The representation of a valid CAN frame is known here.
		 * So try to get CAN frames and ErrorFrames and convert them.
		 */

		/* check classic CAN format or the CANFD/CANXL tag which can take different types */
		if (sscanf(buf, "%llu.%llu %9s ", &sec,  &usec, tmp1) == 3) {
			if (!strncmp(tmp1, "CANXL", 5))
				eval_canxl(buf, &date_tv, timestamps, dplace, disable_dir, outfile);
			else if (!strncmp(tmp1, "CANFD", 5))
				eval_canfd(buf, &date_tv, timestamps, dplace, disable_dir, outfile);
			else
				eval_can(buf, &date_tv, timestamps, base, dplace, disable_dir, outfile);
		}
	}
	fclose(outfile);
	fclose(infile);
	return 0;
}